

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void doTruncatedFile(char *fileName,int64_t offset)

{
  long *plVar1;
  undefined8 *puVar2;
  void *pvVar3;
  ulong uVar4;
  size_t __nbytes;
  int __fd;
  string outName;
  File f;
  File outFile;
  allocator<char> local_e9;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  File local_88;
  File local_50;
  
  File::File(&local_88);
  File::File(&local_50);
  File::open(&local_88,fileName,1,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,fileName,&local_e9);
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,".back","");
  uVar4 = 0xf;
  if (local_a8 != local_98) {
    uVar4 = local_98[0];
  }
  if (uVar4 < (ulong)(local_c0 + local_a0)) {
    uVar4 = 0xf;
    if (local_c8 != local_b8) {
      uVar4 = local_b8[0];
    }
    if ((ulong)(local_c0 + local_a0) <= uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_a8);
      goto LAB_001965cf;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_c8);
LAB_001965cf:
  local_e8 = &local_d8;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_d8 = *plVar1;
    uStack_d0 = puVar2[3];
  }
  else {
    local_d8 = *plVar1;
    local_e8 = (long *)*puVar2;
  }
  local_e0 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  __nbytes = 0;
  File::open(&local_50,(char *)local_e8,2);
  pvVar3 = operator_new__(0x10000);
  File::seek(&local_88,offset,smBegin);
  __fd = (int)pvVar3;
  uVar4 = File::read(&local_88,__fd,(void *)0x10000,__nbytes);
  while (0 < (int)uVar4) {
    File::write(&local_50,__fd,(void *)(uVar4 & 0xffffffff),__nbytes);
    uVar4 = File::read(&local_88,__fd,(void *)0x10000,__nbytes);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  File::~File(&local_50);
  File::~File(&local_88);
  return;
}

Assistant:

void doTruncatedFile(const char* fileName, const int64_t offset)
{
    File f;
    File outFile;

    f.open(fileName, File::ofRead);
    const std::string outName = std::string(fileName) + std::string(".back");
    outFile.open(outName.c_str(), File::ofWrite);

    constexpr uint32_t bufSize = 1024 * 64;
    const auto buffer = new uint8_t[bufSize];
    f.seek(offset);
    int readed = f.read(buffer, bufSize);
    while (readed > 0)
    {
        outFile.write(buffer, readed);
        readed = f.read(buffer, bufSize);
    }
}